

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O1

void permute(fdb_kvs_handle *kv,char *a,int l,int r)

{
  char cVar1;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  fdb_doc *doc;
  char keybuf [256];
  char metabuf [256];
  char bodybuf [1024];
  fdb_doc *local_640;
  char local_638 [256];
  char local_538 [256];
  char local_438 [1032];
  
  local_640 = (fdb_doc *)0x0;
  uVar3 = 0;
  do {
    local_438[uVar3] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[uVar3 % 0x3e];
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x400);
  local_438[0x3ff] = 0;
  if (l == r) {
    sprintf(local_638,a,(ulong)(uint)l);
    sprintf(local_538,"meta%d",(ulong)(uint)r);
    keylen = strlen(local_638);
    metalen = strlen(local_538);
    bodylen = strlen(local_438);
    fdb_doc_create(&local_640,local_638,keylen,local_538,metalen,local_438,bodylen);
    fdb_set(kv,local_640);
    fdb_doc_free(local_640);
  }
  else if (l <= r) {
    pcVar4 = a + l;
    lVar2 = 0;
    do {
      cVar1 = *pcVar4;
      *pcVar4 = pcVar4[lVar2];
      pcVar4[lVar2] = cVar1;
      permute(kv,a,l + 1,r);
      cVar1 = *pcVar4;
      *pcVar4 = pcVar4[lVar2];
      pcVar4[lVar2] = cVar1;
      lVar2 = lVar2 + 1;
    } while ((r - l) + 1 != (int)lVar2);
  }
  return;
}

Assistant:

void permute(fdb_kvs_handle *kv, char *a, int l, int r) {

    int i;
    char keybuf[256], metabuf[256], bodybuf[1024];
    fdb_doc *doc = NULL;
    str_gen(bodybuf, 1024);

    if (l == r) {
        sprintf(keybuf, a, l);
        sprintf(metabuf, "meta%d", r);
        fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
                       (void*)metabuf, strlen(metabuf),
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv, doc);
        fdb_doc_free(doc);
    } else {
        for (i = l; i <= r; i++) {
            swap((a+l), (a+i));
            permute(kv, a, l+1, r);
            swap((a+l), (a+i)); //backtrack
        }
    }
}